

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrLDA0xb5(CPU *this)

{
  byte bVar1;
  
  bVar1 = zeropage_x_addr(this);
  this->A = bVar1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return 4;
}

Assistant:

int CPU::instrLDA0xb5() {
	LDA(zeropage_x_addr());
	return 4;
}